

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_test.c
# Opt level: O2

void test_msg_trim_header(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  nng_msg *local_30;
  nng_msg *msg;
  
  nVar1 = nng_msg_alloc(&local_30,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,99,"%s: expected success, got %s (%d)","nng_msg_alloc(&msg, 0)",pcVar3,
                         nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_msg_header_append(local_30,"abcdef",7);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                           ,100,"%s: expected success, got %s (%d)",
                           "nng_msg_header_append(msg, \"abcdef\", 7)",pcVar3,nVar1);
    if (iVar2 != 0) {
      sVar4 = nng_msg_header_len(local_30);
      iVar2 = acutest_check_((uint)(sVar4 == 7),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                             ,0x65,"%s","nng_msg_header_len(msg) == 7");
      if (iVar2 != 0) {
        nVar1 = nng_msg_header_trim(local_30,2);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                               ,0x66,"%s: expected success, got %s (%d)",
                               "nng_msg_header_trim(msg, 2)",pcVar3,nVar1);
        if (iVar2 != 0) {
          sVar4 = nng_msg_header_len(local_30);
          iVar2 = acutest_check_((uint)(sVar4 == 5),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                 ,0x67,"%s","nng_msg_header_len(msg) == 5");
          if (iVar2 != 0) {
            pcVar3 = (char *)nng_msg_header(local_30);
            iVar2 = strcmp(pcVar3,"cdef");
            iVar2 = acutest_check_((uint)(iVar2 == 0),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                   ,0x68,"%s","strcmp(nng_msg_header(msg), \"cdef\") == 0");
            if (iVar2 != 0) {
              nVar1 = nng_msg_header_trim(local_30,10);
              pcVar3 = nng_strerror(NNG_EINVAL);
              acutest_check_((uint)(nVar1 == NNG_EINVAL),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                             ,0x69,"%s fails with %s","nng_msg_header_trim(msg, 10)",pcVar3);
              pcVar3 = nng_strerror(NNG_EINVAL);
              pcVar5 = nng_strerror(nVar1);
              acutest_message_("%s: expected %s (%d), got %s (%d)","nng_msg_header_trim(msg, 10)",
                               pcVar3,3,pcVar5,(ulong)nVar1);
              nng_msg_free(local_30);
              return;
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_msg_trim_header(void)
{
	nng_msg *msg;
	NUTS_PASS(nng_msg_alloc(&msg, 0));
	NUTS_PASS(nng_msg_header_append(msg, "abcdef", 7));
	NUTS_ASSERT(nng_msg_header_len(msg) == 7);
	NUTS_PASS(nng_msg_header_trim(msg, 2));
	NUTS_ASSERT(nng_msg_header_len(msg) == 5);
	NUTS_ASSERT(strcmp(nng_msg_header(msg), "cdef") == 0);
	NUTS_FAIL(nng_msg_header_trim(msg, 10), NNG_EINVAL);
	nng_msg_free(msg);
}